

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_read(uv_loop_t *loop,uv_fs_t *req,uv_file file,uv_buf_t *bufs,uint nbufs,int64_t off,
              uv_fs_cb cb)

{
  uv_buf_t *puVar1;
  int64_t off_local;
  uint nbufs_local;
  uv_buf_t *bufs_local;
  uv_file file_local;
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  
  if ((bufs == (uv_buf_t *)0x0) || (nbufs == 0)) {
    loop_local._4_4_ = -0x16;
  }
  else {
    req->type = UV_FS;
    if (cb != (uv_fs_cb)0x0) {
      uv__req_init(loop,(uv_req_t *)req,UV_FS);
    }
    req->fs_type = UV_FS_READ;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->loop = loop;
    req->path = (char *)0x0;
    req->new_path = (char *)0x0;
    req->cb = cb;
    req->file = file;
    req->nbufs = nbufs;
    req->bufs = req->bufsml;
    if (4 < nbufs) {
      puVar1 = (uv_buf_t *)uv__malloc((ulong)nbufs << 4);
      req->bufs = puVar1;
    }
    if (req->bufs == (uv_buf_t *)0x0) {
      if (cb != (uv_fs_cb)0x0) {
        if (loop->active_reqs == (void **)loop->active_reqs[0]) {
          __assert_fail("uv__has_active_reqs(loop)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/fs.c"
                        ,0x4b2,
                        "int uv_fs_read(uv_loop_t *, uv_fs_t *, uv_file, const uv_buf_t *, unsigned int, int64_t, uv_fs_cb)"
                       );
        }
        *(void **)req->active_queue[1] = req->active_queue[0];
        *(void **)((long)req->active_queue[0] + 8) = req->active_queue[1];
      }
      loop_local._4_4_ = -0xc;
    }
    else {
      memcpy(req->bufs,bufs,(ulong)nbufs << 4);
      req->off = off;
      if (cb == (uv_fs_cb)0x0) {
        uv__fs_work(&req->work_req);
        loop_local._4_4_ = (int)req->result;
      }
      else {
        uv__work_submit(loop,&req->work_req,uv__fs_work,uv__fs_done);
        loop_local._4_4_ = 0;
      }
    }
  }
  return loop_local._4_4_;
}

Assistant:

int uv_fs_read(uv_loop_t* loop, uv_fs_t* req,
               uv_file file,
               const uv_buf_t bufs[],
               unsigned int nbufs,
               int64_t off,
               uv_fs_cb cb) {
  INIT(READ);

  if (bufs == NULL || nbufs == 0)
    return UV_EINVAL;

  req->file = file;

  req->nbufs = nbufs;
  req->bufs = req->bufsml;
  if (nbufs > ARRAY_SIZE(req->bufsml))
    req->bufs = uv__malloc(nbufs * sizeof(*bufs));

  if (req->bufs == NULL)
    return UV_ENOMEM;

  memcpy(req->bufs, bufs, nbufs * sizeof(*bufs));

  req->off = off;
  POST;
}